

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

bool comparesEqual(QString *lhs,char *rhs)

{
  QByteArrayView rhs_00;
  bool bVar1;
  qsizetype in_RSI;
  char **in_RDI;
  long in_FS_OFFSET;
  QByteArrayView *in_stack_ffffffffffffffe0;
  QString *in_stack_ffffffffffffffe8;
  storage_type *psVar2;
  
  psVar2 = *(storage_type **)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<const_char_*,_true>(in_stack_ffffffffffffffe0,in_RDI);
  rhs_00.m_data = psVar2;
  rhs_00.m_size = in_RSI;
  bVar1 = comparesEqual(in_stack_ffffffffffffffe8,rhs_00);
  if (*(storage_type **)(in_FS_OFFSET + 0x28) == psVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool comparesEqual(const QString &lhs, const char *rhs) noexcept
    { return comparesEqual(lhs, QByteArrayView(rhs)); }